

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

void __thiscall
mjs::string_object::do_debug_print_extra
          (string_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  wstring wStack_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  wstring_view local_28;
  
  local_48[0] = local_38;
  std::__cxx11::wstring::_M_construct((ulong)local_48,indent);
  pwVar1 = std::operator<<(os,(wstring *)local_48);
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: \"");
  local_28 = view(this);
  cpp_quote_abi_cxx11_(&wStack_68,(mjs *)&local_28,(wstring_view *)local_28._M_str);
  pwVar1 = std::operator<<(pwVar1,(wstring *)&wStack_68);
  std::operator<<(pwVar1,"\"\n");
  std::__cxx11::wstring::~wstring((wstring *)&wStack_68);
  std::__cxx11::wstring::~wstring((wstring *)local_48);
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        os << std::wstring(indent, ' ') << "[[Value]]: \"" << cpp_quote(view()) << "\"\n";
    }